

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall OpenSteer::Camera::mouseAdjustOffset(Camera *this,Vec3 *adjustment)

{
  AbstractVehicle *pAVar1;
  undefined1 auVar2 [12];
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  float extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa_00;
  Vec3 VVar4;
  Vec3 local_40;
  Vec3 local_30;
  
  if (this->mode - cmFixed < 5) {
    pAVar1 = this->vehicleToTrack;
    switch(this->mode) {
    case cmFixed:
      local_30 = Vec3::operator-(&this->fixedPosition,&this->fixedTarget);
      local_40 = mouseAdjustPolar(this,adjustment,&local_30);
      VVar4 = Vec3::operator+(&this->fixedTarget,&local_40);
      this->fixedPosition = VVar4;
      break;
    case cmStraightDown:
      auVar2._4_8_ = 0;
      auVar2._0_4_ = this->lookdownDistance;
      local_30 = (Vec3)(auVar2 << 0x40);
      VVar4 = mouseAdjustPolar(this,adjustment,&local_30);
      this->lookdownDistance = VVar4.z;
      break;
    case cmFixedDistanceOffset:
      (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      local_30 = Vec3::operator-(&local_40,&this->target);
      local_40 = mouseAdjustPolar(this,adjustment,&local_30);
      VVar4 = Vec3::operator+(&this->target,&local_40);
      (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
                (VVar4._0_8_,VVar4.z,this);
      fVar3 = Vec3::length(&local_40);
      this->fixedDistDistance = fVar3;
      (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      this->fixedDistVOffset = extraout_XMM0_Db - (this->target).y;
      break;
    case cmFixedLocalOffset:
      (*(pAVar1->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xf])
                (pAVar1,&this->fixedLocalOffset);
      local_40 = mouseAdjustPolar(this,adjustment,&local_30);
      fVar3 = local_40.z;
      (*(pAVar1->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xc])(pAVar1);
      (this->fixedLocalOffset).x = (float)(int)extraout_XMM0_Qa_00;
      (this->fixedLocalOffset).y = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      (this->fixedLocalOffset).z = fVar3;
      break;
    case cmOffsetPOV:
      (*(pAVar1->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xf])(pAVar1,&this->povOffset);
      local_40 = mouseAdjustOrtho(this,adjustment,&local_30);
      fVar3 = local_40.z;
      (*(pAVar1->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xc])(pAVar1);
      (this->povOffset).x = (float)(int)extraout_XMM0_Qa;
      (this->povOffset).y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      (this->povOffset).z = fVar3;
    }
  }
  return;
}

Assistant:

void 
OpenSteer::Camera::mouseAdjustOffset (const Vec3& adjustment)
{
    // vehicle being tracked (just a reference with a more concise name)
    const AbstractVehicle& v = *vehicleToTrack;

    switch (mode)
    {
    case cmFixed:
        {
            const Vec3 offset = fixedPosition - fixedTarget;
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            fixedPosition = fixedTarget + adjusted;
            break;
        }
    case cmFixedDistanceOffset:
        {
            // XXX this is the oddball case, adjusting "position" instead
            // XXX of mode parameters, hence no smoothing during adjustment
            // XXX Plus the fixedDistVOffset feature complicates things
            const Vec3 offset = position() - target;
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            // XXX --------------------------------------------------
//             position = target + adjusted;
//             fixedDistDistance = adjusted.length();
//             fixedDistVOffset = position.y - target.y;
            // XXX --------------------------------------------------
//             const float s = smoothMoveSpeed * (1.0f/40f);
//             const Vec3 newPosition = target + adjusted;
//             position = interpolate (s, position, newPosition);
//             fixedDistDistance = interpolate (s, fixedDistDistance, adjusted.length());
//             fixedDistVOffset = interpolate (s, fixedDistVOffset, position.y - target.y);
            // XXX --------------------------------------------------
//          position = target + adjusted;
            setPosition (target + adjusted);
            fixedDistDistance = adjusted.length();
//          fixedDistVOffset = position.y - target.y;
            fixedDistVOffset = position().y - target.y;
            // XXX --------------------------------------------------
            break;
        }
    case cmStraightDown:
        {
            const Vec3 offset (0, 0, lookdownDistance);
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            lookdownDistance = adjusted.z;
            break;
        }
    case cmFixedLocalOffset:
        {
            const Vec3 offset = v.globalizeDirection (fixedLocalOffset);
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            fixedLocalOffset = v.localizeDirection (adjusted);
            break;
        }
    case cmOffsetPOV:
        {
            // XXX this might work better as a translation control, it is
            // XXX non-obvious using a polar adjustment when the view
            // XXX center is not at the camera aim target
            const Vec3 offset = v.globalizeDirection (povOffset);
            const Vec3 adjusted = mouseAdjustOrtho (adjustment, offset);
            povOffset = v.localizeDirection (adjusted);
            break;
        }
    default:
        break;
    }
}